

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O3

IterateResult __thiscall gl3cts::ReservedNamesTest::iterate(ReservedNamesTest *this)

{
  ostringstream *this_00;
  _shader_type shader_type;
  _language_feature language_feature;
  pointer pcVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  ContextType ctxType;
  int iVar5;
  deUint32 dVar6;
  GLuint GVar7;
  undefined4 extraout_var;
  size_t sVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pointer pbVar11;
  undefined8 uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  qpTestResult testResult;
  char *pcVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  pointer pbVar16;
  GLint compile_status;
  char *so_body_string_raw;
  string current_invalid_name;
  string so_body_string;
  int local_28c;
  pointer local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  char *local_260;
  undefined1 local_258 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  char local_218;
  undefined7 uStack_217;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  string local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  ios_base local_140 [272];
  long lVar8;
  
  local_28c = 1;
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x124);
  if (bVar3) {
    (**(code **)(lVar8 + 0x868))(0x92d5,&this->m_max_gs_acs);
    (**(code **)(lVar8 + 0x868))(0x92d3,&this->m_max_tc_acs);
    (**(code **)(lVar8 + 0x868))(0x92d4,&this->m_max_te_acs);
    (**(code **)(lVar8 + 0x868))(0x92d2,&this->m_max_vs_acs);
  }
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x134);
  if (bVar3) {
    (**(code **)(lVar8 + 0x868))(0x90da,&this->m_max_fs_ssbos);
    (**(code **)(lVar8 + 0x868))(0x90d7,&this->m_max_gs_ssbos);
    (**(code **)(lVar8 + 0x868))(0x90d8,&this->m_max_tc_ssbos);
    (**(code **)(lVar8 + 0x868))(0x90d9,&this->m_max_te_ssbos);
    (**(code **)(lVar8 + 0x868))(0x90d6,&this->m_max_vs_ssbos);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glGetIntegerv() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x1507);
  }
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x104);
  if (bVar3) {
    GVar7 = (**(code **)(lVar8 + 0x3f0))(0x8e88);
    this->m_so_ids[3] = GVar7;
    GVar7 = (**(code **)(lVar8 + 0x3f0))(0x8e87);
    this->m_so_ids[4] = GVar7;
  }
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x134);
  if (bVar3) {
    GVar7 = (**(code **)(lVar8 + 0x3f0))(0x91b9);
    this->m_so_ids[0] = GVar7;
  }
  GVar7 = (**(code **)(lVar8 + 0x3f0))(0x8b30);
  this->m_so_ids[1] = GVar7;
  GVar7 = (**(code **)(lVar8 + 0x3f0))(0x8dd9);
  this->m_so_ids[2] = GVar7;
  GVar7 = (**(code **)(lVar8 + 0x3f0))(0x8b31);
  this->m_so_ids[5] = GVar7;
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glCreateShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                  ,0x151a);
  getReservedNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_258,this);
  local_1a8[0]._0_8_ =
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1b8._8_8_ =
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1b8._0_8_ =
       local_278.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_258._16_8_;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_258._0_8_;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_258._8_8_;
  local_258._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_258._8_8_ = (pointer)0x0;
  local_258._16_8_ = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_258);
  getSupportedShaderTypes
            ((vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
              *)local_1b8,this);
  uVar2 = local_1b8._0_8_;
  local_288 = (pointer)local_1a8[0]._0_8_;
  local_1c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._8_8_;
  if (local_1b8._0_8_ == local_1b8._8_8_) {
    pcVar14 = "Pass";
    testResult = QP_TEST_RESULT_PASS;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    uVar12 = (pointer)0x0;
  }
  else {
    this_00 = (ostringstream *)(local_1b8 + 8);
    bVar3 = true;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._0_8_;
    pbVar11 = (pointer)0x0;
    do {
      this_01 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8;
      shader_type = *(_shader_type *)paVar10;
      uVar12 = pbVar11;
      if (this->m_so_ids[shader_type] != 0) {
        local_238 = paVar10;
        getSupportedLanguageFeatures
                  ((vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
                    *)this_01,this,shader_type);
        uVar12 = local_1a8[0]._M_allocated_capacity;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8._0_8_;
        local_230 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8._8_8_;
        local_1b8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_1b8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_1a8[0]._M_allocated_capacity = (pointer)0x0;
        if ((paVar13 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0) &&
           (operator_delete(paVar13,(long)pbVar11 - (long)paVar13),
           this_01 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_1b8._0_8_,
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1b8._0_8_ !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0)) {
          operator_delete((void *)local_1b8._0_8_,
                          local_1a8[0]._M_allocated_capacity - local_1b8._0_8_);
        }
        paVar10 = local_238;
        paVar13 = paVar15;
        if (paVar15 != local_230) {
          local_280 = paVar15;
          pbVar11 = local_278.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          do {
            language_feature = *(_language_feature *)paVar15;
            local_1c0 = paVar15;
            bVar4 = isStructAllowed((ReservedNamesTest *)this_01,shader_type,language_feature);
            pbVar16 = local_278.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_278.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != pbVar11) {
              do {
                local_258._0_8_ = local_258 + 0x10;
                pcVar1 = (pbVar16->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_258,pcVar1,pcVar1 + pbVar16->_M_string_length);
                local_228._M_allocated_capacity = (size_type)&local_218;
                local_228._8_8_ = 0;
                local_218 = '\0';
                local_260 = (char *)0x0;
                if ((!bVar4) || (iVar5 = std::__cxx11::string::compare(local_258), iVar5 != 0)) {
                  getShaderBody_abi_cxx11_
                            ((string *)local_1b8,this,shader_type,language_feature,
                             (char *)local_258._0_8_);
                  std::__cxx11::string::operator=
                            ((string *)local_228._M_local_buf,(string *)local_1b8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b8._0_8_ != local_1a8) {
                    operator_delete((void *)local_1b8._0_8_,
                                    (ulong)(local_1a8[0]._M_allocated_capacity + 1));
                  }
                  local_260 = (char *)local_228._M_allocated_capacity;
                  (**(code **)(lVar8 + 0x12b8))(this->m_so_ids[shader_type],1,&local_260,0);
                  dVar6 = (**(code **)(lVar8 + 0x800))();
                  glu::checkError(dVar6,"glShaderSource() call failed.",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                                  ,0x154c);
                  (**(code **)(lVar8 + 0x248))(this->m_so_ids[shader_type]);
                  dVar6 = (**(code **)(lVar8 + 0x800))();
                  glu::checkError(dVar6,"glCompileShader() call failed.",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                                  ,0x154f);
                  (**(code **)(lVar8 + 0xa70))(this->m_so_ids[shader_type],0x8b81,&local_28c);
                  dVar6 = (**(code **)(lVar8 + 0x800))();
                  glu::checkError(dVar6,"glGetShaderiv() call failed.",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                                  ,0x1552);
                  if (local_28c != 0) {
                    local_1b8._0_8_ =
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                    std::__cxx11::ostringstream::ostringstream(this_00);
                    pcVar14 = "A ";
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"A ",2);
                    getLanguageFeatureName_abi_cxx11_
                              (&local_1e8,(ReservedNamesTest *)pcVar14,language_feature);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,local_1e8._M_dataplus._M_p,
                               local_1e8._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00," named [",8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,(char *)local_258._0_8_,local_258._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
                    pcVar14 = ", defined in ";
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,", defined in ",0xd);
                    getShaderTypeName_abi_cxx11_
                              ((string *)&local_208,(ReservedNamesTest *)pcVar14,shader_type);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,(char *)local_208._M_allocated_capacity,
                               local_208._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,
                               ", was accepted by the compiler, which is prohibited by the spec. Offending source code:\n>>\n"
                               ,0x5b);
                    pcVar14 = local_260;
                    if (local_260 == (char *)0x0) {
                      std::ios::clear((int)this_00 + (int)*(undefined8 *)(local_1b8._8_8_ + -0x18));
                    }
                    else {
                      sVar9 = strlen(local_260);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)this_00,pcVar14,sVar9);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,"\n<<\n\n",5);
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_1b8,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_208._M_allocated_capacity != &local_1f8) {
                      operator_delete((void *)local_208._M_allocated_capacity,
                                      local_1f8._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                      operator_delete(local_1e8._M_dataplus._M_p,
                                      local_1e8.field_2._M_allocated_capacity + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream(this_00);
                    std::ios_base::~ios_base(local_140);
                    bVar3 = false;
                  }
                }
                if ((char *)local_228._M_allocated_capacity != &local_218) {
                  operator_delete((void *)local_228._M_allocated_capacity,
                                  CONCAT71(uStack_217,local_218) + 1);
                }
                this_01 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_258._0_8_;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_258._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_258 + 0x10)) {
                  operator_delete((void *)local_258._0_8_,
                                  (ulong)((long)&((_Alloc_hider *)local_258._16_8_)->_M_p + 1));
                }
                pbVar11 = pbVar16 + 1;
                pbVar16 = pbVar11;
              } while (pbVar11 !=
                       local_278.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_1c0 + 4);
            paVar10 = local_238;
            paVar13 = local_280;
          } while (paVar15 != local_230);
        }
      }
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar10 + 4);
      pbVar11 = (pointer)uVar12;
    } while (paVar10 != local_1c8);
    testResult = (qpTestResult)(byte)~bVar3;
    pcVar14 = "Fail";
    if (bVar3) {
      pcVar14 = "Pass";
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,pcVar14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uVar2 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)uVar2,(long)local_288 - uVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278);
  if (paVar13 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(paVar13,uVar12 - (long)paVar13);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ReservedNamesTest::iterate()
{
	glw::GLint					   compile_status = GL_TRUE;
	glu::ContextType			   context_type   = m_context.getRenderContext().getType();
	const glw::Functions&		   gl			  = m_context.getRenderContext().getFunctions();
	std::vector<_language_feature> language_features;
	std::vector<std::string>	   reserved_names;
	bool						   result = true;
	std::vector<_shader_type>	  shader_types;

	/* Retrieve important GL constant values */
	if (glu::contextSupports(context_type, glu::ApiType::core(4, 2)))
	{
		gl.getIntegerv(GL_MAX_GEOMETRY_ATOMIC_COUNTERS, &m_max_gs_acs);
		gl.getIntegerv(GL_MAX_TESS_CONTROL_ATOMIC_COUNTERS, &m_max_tc_acs);
		gl.getIntegerv(GL_MAX_TESS_EVALUATION_ATOMIC_COUNTERS, &m_max_te_acs);
		gl.getIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTERS, &m_max_vs_acs);
	}

	if (glu::contextSupports(context_type, glu::ApiType::core(4, 3)))
	{
		gl.getIntegerv(GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS, &m_max_fs_ssbos);
		gl.getIntegerv(GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS, &m_max_gs_ssbos);
		gl.getIntegerv(GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS, &m_max_tc_ssbos);
		gl.getIntegerv(GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS, &m_max_te_ssbos);
		gl.getIntegerv(GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS, &m_max_vs_ssbos);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call(s) failed.");
	}

	/* Create the shader objects */
	if (glu::contextSupports(context_type, glu::ApiType::core(4, 0)))
	{
		m_so_ids[SHADER_TYPE_TESS_CONTROL]	= gl.createShader(GL_TESS_CONTROL_SHADER);
		m_so_ids[SHADER_TYPE_TESS_EVALUATION] = gl.createShader(GL_TESS_EVALUATION_SHADER);
	}

	if (glu::contextSupports(context_type, glu::ApiType::core(4, 3)))
	{
		m_so_ids[SHADER_TYPE_COMPUTE] = gl.createShader(GL_COMPUTE_SHADER);
	}

	m_so_ids[SHADER_TYPE_FRAGMENT] = gl.createShader(GL_FRAGMENT_SHADER);
	m_so_ids[SHADER_TYPE_GEOMETRY] = gl.createShader(GL_GEOMETRY_SHADER);
	m_so_ids[SHADER_TYPE_VERTEX]   = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

	/* Retrieve context version-specific data */
	reserved_names = getReservedNames();
	shader_types   = getSupportedShaderTypes();

	/* Iterate over all supported shader stages.. */
	for (std::vector<_shader_type>::const_iterator shader_type_it = shader_types.begin();
		 shader_type_it != shader_types.end(); ++shader_type_it)
	{
		_shader_type current_shader_type = *shader_type_it;

		if (m_so_ids[current_shader_type] == 0)
		{
			/* Skip stages not supported by the currently running context version. */
			continue;
		}

		language_features = getSupportedLanguageFeatures(current_shader_type);

		/* ..and all language features we can test for the running context */
		for (std::vector<_language_feature>::const_iterator language_feature_it = language_features.begin();
			 language_feature_it != language_features.end(); ++language_feature_it)
		{
			_language_feature current_language_feature = *language_feature_it;

			bool structAllowed = isStructAllowed(current_shader_type, current_language_feature);

			/* Finally, all the reserved names we need to test - loop over them at this point */
			for (std::vector<std::string>::const_iterator reserved_name_it = reserved_names.begin();
				 reserved_name_it != reserved_names.end(); ++reserved_name_it)
			{
				std::string current_invalid_name = *reserved_name_it;
				std::string so_body_string;
				const char* so_body_string_raw = NULL;

				// There are certain shader types that allow struct for in/out declarations
				if (structAllowed && current_invalid_name.compare("struct") == 0)
				{
					continue;
				}

				/* Form the shader body */
				so_body_string =
					getShaderBody(current_shader_type, current_language_feature, current_invalid_name.c_str());
				so_body_string_raw = so_body_string.c_str();

				/* Try to compile the shader */
				gl.shaderSource(m_so_ids[current_shader_type], 1, /* count */
								&so_body_string_raw, NULL);		  /* length */
				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

				gl.compileShader(m_so_ids[current_shader_type]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

				gl.getShaderiv(m_so_ids[current_shader_type], GL_COMPILE_STATUS, &compile_status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

/* Left for the debugging purposes for those in need .. */
#if 0
				char temp[4096];

				gl.getShaderInfoLog(m_so_ids[current_shader_type],
					4096,
					NULL,
					temp);

				m_testCtx.getLog() << tcu::TestLog::Message
					<< "\n"
					"-----------------------------\n"
					"Shader:\n"
					">>\n"
					<< so_body_string_raw
					<< "\n<<\n"
					"\n"
					"Info log:\n"
					">>\n"
					<< temp
					<< "\n<<\n\n"
					<< tcu::TestLog::EndMessage;
#endif

				if (compile_status != GL_FALSE)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "A "
									   << getLanguageFeatureName(current_language_feature) << " named ["
									   << current_invalid_name << "]"
									   << ", defined in " << getShaderTypeName(current_shader_type)
									   << ", was accepted by the compiler, "
										  "which is prohibited by the spec. Offending source code:\n"
										  ">>\n"
									   << so_body_string_raw << "\n<<\n\n"
									   << tcu::TestLog::EndMessage;

					result = false;
				}

			} /* for (all reserved names for the current context) */
		}	 /* for (all language features supported by the context) */
	}		  /* for (all shader types supported by the context) */

	m_testCtx.setTestResult(result ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, result ? "Pass" : "Fail");

	return STOP;
}